

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this)

{
  undefined8 *puVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcRelDecomposes + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcRelDecomposes).field_0x0 + lVar2);
  *(undefined8 *)(&(this->super_IfcRelDecomposes).field_0x0 + lVar2) = 0x90d318;
  *(undefined8 *)(&(this->super_IfcRelDecomposes).field_0xd8 + lVar2) = 0x90d390;
  *(undefined8 *)(&(this->super_IfcRelDecomposes).field_0x88 + lVar2) = 0x90d340;
  *(undefined8 *)
   ((long)&(this->super_IfcRelDecomposes).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>._vptr_ObjectHelper +
   lVar2) = 0x90d368;
  pvVar3 = *(void **)(&(this->super_IfcRelDecomposes).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x18
                     + lVar2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3);
  }
  *puVar1 = 0x90d430;
  puVar1[0x1b] = 0x90d458;
  if ((undefined8 *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((undefined8 *)puVar1[0xc]);
  }
  if ((undefined8 *)puVar1[7] != puVar1 + 9) {
    operator_delete((undefined8 *)puVar1[7]);
  }
  if ((undefined8 *)puVar1[2] != puVar1 + 4) {
    operator_delete((undefined8 *)puVar1[2]);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}